

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O0

string * CLI::NonexistentPath(string *__return_storage_ptr__,string *filename)

{
  int iVar1;
  char *__file;
  undefined1 local_a8 [7];
  bool exist;
  stat buffer;
  string *filename_local;
  
  buffer.__glibc_reserved[2] = (__syscall_slong_t)filename;
  __file = (char *)::std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a8);
  if (iVar1 == 0) {
    ::std::operator+(__return_storage_ptr__,"Path already exists: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     buffer.__glibc_reserved[2]);
  }
  else {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string NonexistentPath(const std::string &filename) {
    struct stat buffer;
    bool exist = stat(filename.c_str(), &buffer) == 0;
    if(exist) {
        return "Path already exists: " + filename;
    }
    return std::string();
}